

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool cmExecProgramCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  _Alloc_hider _Var11;
  Encoding in_R9D;
  bool bVar12;
  int iVar13;
  pointer pbVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string_view value_00;
  string output_variable;
  string arguments;
  string command;
  string return_variable;
  string coutput;
  int retVal;
  string output;
  string local_1d8;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  string local_178;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_158;
  undefined8 local_140;
  undefined1 *local_138;
  undefined8 local_130;
  long local_128;
  undefined1 *local_120;
  undefined8 local_118;
  string local_f0;
  pointer local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 == local_d0) {
    local_158.first._M_len = (size_t)&local_158.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_158.first._M_len
        != &local_158.second) {
      operator_delete((void *)local_158.first._M_len,
                      (ulong)((long)&((local_158.second)->_M_dataplus)._M_p + 1));
    }
    return false;
  }
  local_1b8 = &local_1a8;
  bVar10 = false;
  local_1b0 = 0;
  local_1a8 = 0;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  iVar13 = 0;
  bVar12 = false;
  bVar3 = false;
  do {
    iVar4 = std::__cxx11::string::compare((char *)pbVar14);
    if (iVar4 == 0) {
      iVar13 = iVar13 + 1;
LAB_00205da7:
      bVar12 = false;
LAB_00205de9:
      bVar10 = false;
    }
    else if (bVar3) {
      if (local_1d8._M_string_length != 0) {
        local_158.first._M_len = (size_t)&local_158.second;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"called with incorrect number of arguments","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002062b9:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            local_158.first._M_len != &local_158.second) {
          operator_delete((void *)local_158.first._M_len,
                          (ulong)((long)&((local_158.second)->_M_dataplus)._M_p + 1));
        }
        bVar3 = false;
        goto LAB_002062d8;
      }
      std::__cxx11::string::_M_assign((string *)&local_1d8);
      iVar13 = iVar13 + 1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)pbVar14);
      if (iVar5 == 0) {
        iVar13 = iVar13 + 1;
        bVar12 = true;
        goto LAB_00205de9;
      }
      if (bVar12) {
        if (local_178._M_string_length != 0) {
          local_158.first._M_len = (size_t)&local_158.second;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002062b9;
        }
        std::__cxx11::string::_M_assign((string *)&local_178);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)pbVar14);
        if (iVar5 != 0) {
          if (!bVar10) goto LAB_00205da7;
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)(pbVar14->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_1b8);
        }
        bVar10 = true;
      }
      iVar13 = iVar13 + 1;
      bVar12 = false;
    }
    pbVar14 = pbVar14 + 1;
    bVar3 = iVar4 == 0;
  } while (pbVar14 != local_d0);
  local_190 = 0;
  local_188 = 0;
  local_198 = &local_188;
  if (local_1b0 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_198);
  }
  else {
    cmSystemTools::ConvertToRunCommandPath
              (&local_88,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    local_158.first._M_len = local_88._M_string_length;
    local_158.first._M_str = local_88._M_dataplus._M_p;
    local_138 = (undefined1 *)((long)&local_68.field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 1;
    local_68.field_2._M_local_buf[8] = ' ';
    local_140 = 1;
    local_130 = 0;
    local_128 = local_1b0;
    local_120 = local_1b8;
    local_118 = 0;
    views._M_len = 3;
    views._M_array = &local_158;
    local_158.second = &local_88;
    local_68.field_2._M_allocated_capacity = (size_type)local_138;
    cmCatViews(&local_f0,views);
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,(uint)local_f0._M_dataplus._M_p) !=
        &local_f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_f0._M_dataplus._M_p._4_4_,(uint)local_f0._M_dataplus._M_p),
                      local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  sVar2 = local_1d8._M_string_length;
  local_f0._M_dataplus._M_p._0_4_ = 0;
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity =
       local_68.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) - (long)iVar13 == 2)
  {
    cmsys::SystemTools::MakeDirectory(pbVar14 + 1,(mode_t *)0x0);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_198,local_198 + local_190);
    bVar3 = anon_unknown.dwarf_4788d8::RunCommand
                      (&local_a8,&local_68,(int *)&local_f0,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar2 == 0,
                       in_R9D);
    local_c8.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    _Var11._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) goto LAB_002060eb;
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_198,local_198 + local_190);
    bVar3 = anon_unknown.dwarf_4788d8::RunCommand
                      (&local_c8,&local_68,(int *)&local_f0,(char *)0x0,sVar2 == 0,in_R9D);
    _Var11._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_002060eb;
  }
  operator_delete(_Var11._M_p,local_c8.field_2._M_allocated_capacity + 1);
LAB_002060eb:
  if (bVar3 == false) {
    local_f0._M_dataplus._M_p._0_4_ = 0xffffffff;
  }
  if (local_1d8._M_string_length != 0) {
    uVar6 = std::__cxx11::string::find_first_not_of((char *)&local_68,0x7ae995,0);
    lVar7 = std::__cxx11::string::find_last_not_of((char *)&local_68,0x7ae995,0xffffffffffffffff);
    if (uVar6 == 0xffffffffffffffff) {
      uVar6 = 0;
    }
    lVar9 = local_68._M_string_length - 1;
    if (lVar7 != -1) {
      lVar9 = lVar7;
    }
    std::__cxx11::string::string((string *)&local_158,(string *)&local_68,uVar6,(lVar9 - uVar6) + 1)
    ;
    value._M_str = (char *)local_158.first._M_len;
    value._M_len = (size_t)local_158.first._M_str;
    cmMakefile::AddDefinition(status->Makefile,&local_1d8,value);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_158.first._M_len
        != &local_158.second) {
      operator_delete((void *)local_158.first._M_len,
                      (ulong)((long)&((local_158.second)->_M_dataplus)._M_p + 1));
    }
  }
  if (local_178._M_string_length != 0) {
    snprintf((char *)&local_158,100,"%d",(ulong)(uint)local_f0._M_dataplus._M_p);
    this = status->Makefile;
    sVar8 = strlen((char *)&local_158);
    value_00._M_str = (char *)&local_158;
    value_00._M_len = sVar8;
    cmMakefile::AddDefinition(this,&local_178,value_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1));
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  bVar3 = true;
LAB_002062d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  return bVar3;
}

Assistant:

bool cmExecProgramCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        status.SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmStrCat(cmSystemTools::ConvertToRunCommandPath(args[0]), ' ',
                       arguments);
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = RunCommand(command, output, retVal, args[1].c_str(), verbose);
  } else {
    result = RunCommand(command, output, retVal, nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    status.GetMakefile().AddDefinition(output_variable, coutput);
  }

  if (!return_variable.empty()) {
    char buffer[100];
    snprintf(buffer, sizeof(buffer), "%d", retVal);
    status.GetMakefile().AddDefinition(return_variable, buffer);
  }

  return true;
}